

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_>::fulfill
          (AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_> *this,
          NoCopy *value)

{
  NoCopy *value_00;
  ExceptionOr<NoCopy> local_1b8;
  NoCopy *local_18;
  NoCopy *value_local;
  AdapterPromiseNode<NoCopy,_kj::_::PromiseAndFulfillerAdapter<NoCopy>_> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (NoCopy *)this;
    value_00 = mv<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>(value);
    ExceptionOr<NoCopy>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<NoCopy>::operator=(&this->result,&local_1b8);
    ExceptionOr<NoCopy>::~ExceptionOr(&local_1b8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }